

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_9::DiskHandle::createNamedTemporary
          (String *__return_storage_ptr__,DiskHandle *this,PathPtr finalName,WriteMode mode,
          Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Array<char> *other;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> *this_00;
  PathPtr PVar5;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar6;
  undefined1 uVar7;
  PathPtr finalName_local;
  String path;
  Fault f_1;
  String pathPrefix;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_58;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_48;
  
  pcVar4 = (char *)finalName.parts.size_;
  finalName_local.parts.ptr = finalName.parts.ptr;
  finalName_local.parts.size_ = (size_t)pcVar4;
  if (pcVar4 == (char *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&pathPrefix,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x388,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::fatal((Fault *)&pathPrefix);
  }
  other = (Array<char> *)this;
  if ((anonymous_namespace)::DiskHandle::
      createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)::pid == '\0')
  {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::DiskHandle::
                                 createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                                 ::pid);
    if (iVar3 != 0) {
      createNamedTemporary::pid = getpid();
      __cxa_guard_release(&(anonymous_namespace)::DiskHandle::
                           createNamedTemporary(kj::PathPtr,kj::WriteMode,kj::Function<int(kj::StringPtr)>)
                           ::pid);
    }
  }
  pathPrefix.content.disposer = (ArrayDisposer *)0x0;
  pathPrefix.content.ptr = (char *)0x0;
  pathPrefix.content.size_ = 0;
  if (1 < finalName_local.parts.size_) {
    _f_1 = (ArrayPtr<const_kj::String>)PathPtr::parent(&finalName_local);
    str<kj::PathPtr,char>(&path,(kj *)&f_1,(PathPtr *)&stack0xffffffffffffff46,pcVar4);
    other = &path.content;
    Array<char>::operator=(&pathPrefix.content,other);
    Array<char>::~Array(&path.content);
  }
  uVar6 = 0x2e;
  f_1.exception._0_4_ = createNamedTemporary::counter;
  uVar7 = 0x2e;
  createNamedTemporary::counter = createNamedTemporary::counter + 1;
  pcVar4 = PathPtr::basename(&finalName_local,(char *)other);
  str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
            (&path,(kj *)&pathPrefix,(String *)".kj-tmp.",(char (*) [9])&createNamedTemporary::pid,
             (int *)&stack0xffffffffffffff46,(char *)&f_1,(uint *)&stack0xffffffffffffff47,pcVar4,
             (String *)".partial",
             (char (*) [9])CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffff40)));
  do {
    pcVar4 = "";
    if (path.content.size_ != 0) {
      pcVar4 = path.content.ptr;
    }
    pIVar1 = (tryCreate->impl).ptr;
    iVar3 = (**pIVar1->_vptr_Iface)(pIVar1,pcVar4,path.content.size_ + (path.content.size_ == 0));
    if (-1 < iVar3) goto LAB_003c0052;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
LAB_003c0052:
    (__return_storage_ptr__->content).ptr = path.content.ptr;
    (__return_storage_ptr__->content).size_ = path.content.size_;
    (__return_storage_ptr__->content).disposer = path.content.disposer;
    path.content.ptr = (char *)0x0;
    path.content.size_ = 0;
  }
  else {
    if (iVar3 == 2) {
      if (((mode & CREATE_PARENT) == 0) || (finalName_local.parts.size_ < 2)) {
LAB_003c0115:
        kj::_::Debug::Fault::Fault<int,kj::String&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3a1,iVar3,"create(path)","path",&path);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      PVar5 = PathPtr::parent(&finalName_local);
      bVar2 = tryMkdir(this,PVar5,CREATE_PARENT|MODIFY|CREATE,true);
      if (!bVar2) goto LAB_003c0115;
      PVar5.parts.size_ = finalName_local.parts.size_;
      PVar5.parts.ptr = finalName_local.parts.ptr;
      local_58.disposer = (tryCreate->impl).disposer;
      local_58.ptr = (tryCreate->impl).ptr;
      this_00 = &local_58;
      (tryCreate->impl).ptr = (Iface *)0x0;
      createNamedTemporary
                (__return_storage_ptr__,this,PVar5,mode & ~CREATE_PARENT,
                 (Function<int_(kj::StringPtr)> *)this_00);
    }
    else {
      if (iVar3 != 0x11) goto LAB_003c0115;
      finalName_00.parts.size_ = finalName_local.parts.size_;
      finalName_00.parts.ptr = finalName_local.parts.ptr;
      local_48.disposer = (tryCreate->impl).disposer;
      local_48.ptr = (tryCreate->impl).ptr;
      this_00 = &local_48;
      (tryCreate->impl).ptr = (Iface *)0x0;
      createNamedTemporary
                (__return_storage_ptr__,this,finalName_00,mode,
                 (Function<int_(kj::StringPtr)> *)this_00);
    }
    Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(this_00);
  }
  Array<char>::~Array(&path.content);
  Array<char>::~Array(&pathPrefix.content);
  return __return_storage_ptr__;
}

Assistant:

String createNamedTemporary(
      PathPtr finalName, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Create a temporary file which will eventually replace `finalName`.
    //
    // Calls `tryCreate` to actually create the temporary, passing in the desired path. tryCreate()
    // is expected to behave like a syscall, returning a negative value and setting `errno` on
    // error. tryCreate() MUST fail with EEXIST if the path exists -- this is not checked in
    // advance, since it needs to be checked atomically. In the case of EEXIST, tryCreate() will
    // be called again with a new path.
    //
    // Returns the temporary path that succeeded.

    if (finalName.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self");
    }

    static uint counter = 0;
    static const pid_t pid = getpid();
    String pathPrefix;
    if (finalName.size() > 1) {
      pathPrefix = kj::str(finalName.parent(), '/');
    }
    auto path = kj::str(pathPrefix, HIDDEN_PREFIX, pid, '.', counter++, '.',
                        finalName.basename()[0], ".partial");

    KJ_SYSCALL_HANDLE_ERRORS(tryCreate(path)) {
      case EEXIST:
        return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
      case ENOENT:
        if (has(mode, WriteMode::CREATE_PARENT) && finalName.size() > 1 &&
            tryMkdir(finalName.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                         WriteMode::CREATE_PARENT, true)) {
          // Retry, but make sure we don't try to create the parent again.
          mode = mode - WriteMode::CREATE_PARENT;
          return createNamedTemporary(finalName, mode, kj::mv(tryCreate));
        }
        KJ_FALLTHROUGH;
      default:
        KJ_FAIL_SYSCALL("create(path)", error, path);
    }

    return kj::mv(path);
  }